

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  java *this;
  bool bVar1;
  JavaType type;
  uint32 uVar2;
  FieldType type_00;
  Type TVar3;
  uint uVar4;
  mapped_type *pmVar5;
  protobuf *this_00;
  char *pcVar6;
  int i;
  int i_00;
  int extraout_EDX;
  int iVar7;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  unsigned_long i_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  key_type *pkVar8;
  allocator local_101;
  key_type local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  key_type local_c0;
  key_type local_a0;
  string capitalized_type;
  allocator local_5a;
  allocator local_59;
  key_type local_58;
  uint local_34;
  
  this = (java *)(ulong)(uint)messageBitIndex;
  local_34 = builderBitIndex;
  SetCommonFieldVariables(descriptor,info,variables);
  type = GetJavaType(descriptor);
  PrimitiveTypeName(type);
  std::__cxx11::string::string((string *)&capitalized_type,"type",(allocator *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&capitalized_type);
  BoxedPrimitiveTypeName(type);
  std::__cxx11::string::string((string *)&capitalized_type,"boxed_type",(allocator *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&capitalized_type);
  std::__cxx11::string::string((string *)&capitalized_type,"type",(allocator *)&local_e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&capitalized_type);
  std::__cxx11::string::string((string *)&local_100,"field_type",(allocator *)&local_c0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&capitalized_type);
  ImmutableDefaultValue_abi_cxx11_
            (&capitalized_type,(java *)descriptor,(FieldDescriptor *)name_resolver,
             (ClassNameResolver *)info);
  std::__cxx11::string::string((string *)&local_100,"default",(allocator *)&local_e0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&capitalized_type);
  GetCapitalizedType(descriptor,true);
  std::__cxx11::string::string
            ((string *)&capitalized_type,"capitalized_type",(allocator *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&capitalized_type);
  uVar2 = internal::WireFormat::MakeTag(descriptor);
  SimpleItoa_abi_cxx11_(&capitalized_type,(protobuf *)(ulong)uVar2,i);
  std::__cxx11::string::string((string *)&local_100,"tag",(allocator *)&local_e0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&capitalized_type);
  iVar7 = *(int *)(descriptor + 0x38);
  type_00 = GetType(descriptor);
  this_00 = (protobuf *)internal::WireFormatLite::TagSize(iVar7,type_00);
  SimpleItoa_abi_cxx11_(&capitalized_type,this_00,i_01);
  std::__cxx11::string::string((string *)&local_100,"tag_size",(allocator *)&local_e0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&capitalized_type);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&capitalized_type);
  std::__cxx11::string::string((string *)&capitalized_type,"required",(allocator *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&capitalized_type);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&capitalized_type);
  pcVar6 = PrimitiveTypeName(type);
  std::__cxx11::string::string((string *)&local_100,pcVar6,(allocator *)&local_e0);
  UnderscoresToCamelCase(&capitalized_type,&local_100,true);
  std::__cxx11::string::~string((string *)&local_100);
  if (type < JAVATYPE_STRING) {
    std::operator+(&local_e0,"com.google.protobuf.Internal.",&capitalized_type);
    std::operator+(&local_100,&local_e0,"List");
    std::__cxx11::string::string((string *)&local_c0,"field_list_type",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator+(&local_e0,"empty",&capitalized_type);
    std::operator+(&local_100,&local_e0,"List()");
    std::__cxx11::string::string((string *)&local_c0,"empty_list",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::operator+(&local_100,pmVar5,"_.makeImmutable()");
    std::__cxx11::string::string
              ((string *)&local_c0,"make_name_unmodifiable",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&local_e0,pmVar5,"_.get");
    std::operator+(&local_100,&local_e0,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_get",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&local_e0,pmVar5,"_.add");
    std::operator+(&local_100,&local_e0,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_add",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&local_e0,pmVar5,"_.set");
    std::operator+(&local_100,&local_e0,&capitalized_type);
    std::__cxx11::string::string((string *)&local_a0,"repeated_set",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_100,"visit_type",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::operator+(&local_e0,"visit",&capitalized_type);
    std::operator+(&local_100,&local_e0,"List");
    std::__cxx11::string::string((string *)&local_c0,"visit_type_list",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    this_01 = &local_e0;
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,"boxed_type",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::operator+(&local_e0,"com.google.protobuf.Internal.ProtobufList<",pmVar5);
    std::operator+(&local_100,&local_e0,">");
    std::__cxx11::string::string((string *)&local_a0,"field_list_type",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_100,"empty_list",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::operator+(&local_100,pmVar5,"_.makeImmutable()");
    std::__cxx11::string::string
              ((string *)&local_c0,"make_name_unmodifiable",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::operator+(&local_100,pmVar5,"_.get");
    std::__cxx11::string::string((string *)&local_c0,"repeated_get",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::operator+(&local_100,pmVar5,"_.add");
    std::__cxx11::string::string((string *)&local_c0,"repeated_add",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::operator+(&local_100,pmVar5,"_.set");
    std::__cxx11::string::string((string *)&local_c0,"repeated_set",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_100,"visit_type",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_100,"visit_type_list",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    if (type != JAVATYPE_BYTES) goto LAB_002b4add;
    std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_58);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    ToUpper(&local_e0,pmVar5);
    std::operator+(&local_100,&local_e0,"_DEFAULT_VALUE");
    std::__cxx11::string::string((string *)&local_a0,"bytes_default",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    this_01 = &local_c0;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_002b4add:
  bVar1 = IsReferenceType(type);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_100,"null_check",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
  }
  else {
    std::__cxx11::string::string((string *)&local_100,"null_check",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string((string *)&local_100,"deprecation",(allocator *)&local_e0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&local_100);
  TVar3 = GetType(descriptor);
  uVar4 = FixedSize(TVar3);
  iVar7 = i_00;
  if (uVar4 != 0xffffffff) {
    SimpleItoa_abi_cxx11_(&local_100,(protobuf *)(ulong)uVar4,i_00);
    std::__cxx11::string::string((string *)&local_e0,"fixed_size",(allocator *)&local_c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    iVar7 = extraout_EDX;
  }
  if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
    std::__cxx11::string::string
              ((string *)&local_100,"set_has_field_bit_message",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string
              ((string *)&local_100,"set_has_field_bit_message",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string
              ((string *)&local_100,"clear_has_field_bit_message",(allocator *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_100);
    TVar3 = FieldDescriptor::type(descriptor);
    if (TVar3 == TYPE_BYTES) {
      std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)&local_58);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_c0);
      std::operator+(&local_e0,"!",pmVar5);
      std::operator+(&local_100,&local_e0,"_.isEmpty()");
      std::__cxx11::string::string((string *)&local_a0,"is_field_present_message",&local_101);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      pkVar8 = &local_100;
      std::__cxx11::string::operator=((string *)pmVar5,(string *)pkVar8);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      std::__cxx11::string::string((string *)&local_c0,"name",&local_101);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_c0);
      std::operator+(&local_e0,pmVar5,"_ != ");
      std::__cxx11::string::string((string *)&local_a0,"default",&local_59);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a0);
      std::operator+(&local_100,&local_e0,pmVar5);
      std::__cxx11::string::string((string *)&local_58,"is_field_present_message",&local_5a);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_58);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_100);
      pkVar8 = &local_a0;
    }
    std::__cxx11::string::~string((string *)pkVar8);
    std::__cxx11::string::~string((string *)&local_e0);
    pkVar8 = &local_c0;
  }
  else {
    GenerateGetBit_abi_cxx11_(&local_100,this,iVar7);
    std::__cxx11::string::string
              ((string *)&local_e0,"get_has_field_bit_message",(allocator *)&local_c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    GenerateSetBit_abi_cxx11_(&local_e0,this,bitIndex);
    std::operator+(&local_100,&local_e0,";");
    std::__cxx11::string::string
              ((string *)&local_c0,"set_has_field_bit_message",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    GenerateClearBit_abi_cxx11_(&local_e0,this,bitIndex_00);
    std::operator+(&local_100,&local_e0,";");
    std::__cxx11::string::string
              ((string *)&local_c0,"clear_has_field_bit_message",(allocator *)&local_a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    GenerateGetBit_abi_cxx11_(&local_100,this,bitIndex_01);
    std::__cxx11::string::string
              ((string *)&local_e0,"is_field_present_message",(allocator *)&local_c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_e0);
    pkVar8 = &local_100;
    std::__cxx11::string::operator=((string *)pmVar5,(string *)pkVar8);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::~string((string *)pkVar8);
  std::__cxx11::string::string((string *)&local_e0,"name",(allocator *)&local_a0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_e0);
  std::operator+(&local_100,pmVar5,"_.isModifiable()");
  std::__cxx11::string::string((string *)&local_c0,"is_mutable",(allocator *)&local_58);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  GenerateGetBitFromLocal_abi_cxx11_(&local_100,(java *)(ulong)local_34,bitIndex_02);
  std::__cxx11::string::string
            ((string *)&local_e0,"get_has_field_bit_from_local",(allocator *)&local_c0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_e0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  GenerateSetBitToLocal_abi_cxx11_(&local_100,this,bitIndex_03);
  std::__cxx11::string::string
            ((string *)&local_e0,"set_has_field_bit_to_local",(allocator *)&local_c0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_e0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&capitalized_type);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex,
                           int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<string, string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] =
      "com.google.protobuf.GeneratedMessageLite.emptyProtobufList()";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] =
      SimpleItoa(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["clear_has_field_bit_message"] =
        GenerateClearBit(messageBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    (*variables)["is_field_present_message"] =
        "!" + (*variables)["name"] + "_.isEmpty()";
  }

  // For repeated builders, the underlying list tracks mutability state.
  (*variables)["is_mutable"] = (*variables)["name"] + "_.isModifiable()";

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}